

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<unsigned_int> __thiscall
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\xef'>,_kj::parse::ExactlyConst_<char,_'\xbb'>,_kj::parse::ExactlyConst_<char,_'\xbf'>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_> *this,
          Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>
          *subParser,ParserInput *input)

{
  char cVar1;
  NullableValue<unsigned_int> NVar2;
  int iVar3;
  ParserInput subInput;
  undefined1 local_62 [18];
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  iVar3 = 0;
  local_62._2_8_ = this;
  do {
    local_50 = (input->super_IteratorInput<char,_const_char_*>).pos;
    local_48 = (input->super_IteratorInput<char,_const_char_*>).end;
    if (local_50 == local_48) break;
    local_38 = input->begin;
    local_62._10_8_ = input;
    local_40 = local_50;
    Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\xef'>,_kj::parse::ExactlyConst_<char,_'\xbb'>,_kj::parse::ExactlyConst_<char,_'\xbf'>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>
              ((Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>
                *)local_62,(ParserInput *)subParser);
    cVar1 = local_62[0];
    if (local_62[0] == '\x01') {
      ((IteratorInput<char,_const_char_*> *)local_62._10_8_)->pos = local_50;
      iVar3 = iVar3 + 1;
    }
    IteratorInput<char,_const_char_*>::~IteratorInput
              ((IteratorInput<char,_const_char_*> *)(local_62 + 10));
  } while (cVar1 != '\0');
  NVar2.isSet = (bool)local_62[2];
  NVar2._1_3_ = local_62._3_3_;
  NVar2.field_1 = (anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2)local_62._6_4_;
  *(undefined1 *)local_62._2_8_ = 1;
  *(int *)(local_62._2_8_ + 4) = iVar3;
  return (Maybe<unsigned_int>)NVar2;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      if (kj::none != subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }

    if (atLeastOne && count == 0) {
      return kj::none;
    }

    return count;
  }